

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenGlobalInitializer::InitializeCustomTargets(cmQtAutoGenGlobalInitializer *this)

{
  bool bVar1;
  reference ppVar2;
  reference this_00;
  pointer this_01;
  unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_> *initializer;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  *__range1_2;
  pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  undefined1 local_90 [8];
  string comment_1;
  pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end1;
  iterator __begin1;
  map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string comment;
  cmQtAutoGenGlobalInitializer *this_local;
  
  comment.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"Global AUTOGEN target",&local_39);
  std::allocator<char>::~allocator(&local_39);
  __end1 = std::
           map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->GlobalAutoGenTargets_);
  pair = (pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&this->GlobalAutoGenTargets_);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&pair), bVar1) {
    comment_1.field_2._8_8_ =
         std::
         _Rb_tree_iterator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator*(&__end1);
    GetOrCreateGlobalTarget
              (this,((reference)comment_1.field_2._8_8_)->first,
               &((reference)comment_1.field_2._8_8_)->second,(string *)local_38);
    std::
    _Rb_tree_iterator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"Global AUTORCC target",(allocator<char> *)((long)&__range1_1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
  __end1_1 = std::
             map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->GlobalAutoRccTargets_);
  pair_1 = (pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->GlobalAutoRccTargets_);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&pair_1), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1_1);
    GetOrCreateGlobalTarget(this,ppVar2->first,&ppVar2->second,(string *)local_90);
    std::
    _Rb_tree_iterator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::~string((string *)local_90);
  __end1_2 = std::
             vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
             ::begin(&this->Initializers_);
  initializer = (unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_> *)
                std::
                vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
                ::end(&this->Initializers_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_*,_std::vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>_>
                        *)&initializer);
    if (!bVar1) {
      return true;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_*,_std::vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>_>
              ::operator*(&__end1_2);
    this_01 = std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
              ::operator->(this_00);
    bVar1 = cmQtAutoGenInitializer::InitCustomTargets(this_01);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_*,_std::vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>_>
    ::operator++(&__end1_2);
  }
  return false;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::InitializeCustomTargets()
{
  // Initialize global autogen targets
  {
    std::string const comment = "Global AUTOGEN target";
    for (auto const& pair : this->GlobalAutoGenTargets_) {
      this->GetOrCreateGlobalTarget(pair.first, pair.second, comment);
    }
  }
  // Initialize global autorcc targets
  {
    std::string const comment = "Global AUTORCC target";
    for (auto const& pair : this->GlobalAutoRccTargets_) {
      this->GetOrCreateGlobalTarget(pair.first, pair.second, comment);
    }
  }
  // Initialize per target autogen targets
  for (auto& initializer : this->Initializers_) {
    if (!initializer->InitCustomTargets()) {
      return false;
    }
  }
  return true;
}